

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server_func(client_socket *client)

{
  undefined4 fd;
  ssize_t sVar1;
  void *buf_00;
  size_t count;
  allocator local_2061;
  string local_2060 [32];
  string local_2040 [8];
  string ret;
  char local_2018 [4];
  int n;
  char buf [8192];
  int client_sockfd;
  client_socket *client_local;
  
  buf._8188_4_ = client->sockfd;
  while( true ) {
    sVar1 = C_std::Read(buf._8188_4_,local_2018,0x2000);
    if ((int)sVar1 < 1) break;
    local_2018[(int)sVar1] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2060,local_2018,&local_2061);
    algorithm(local_2040);
    std::__cxx11::string::~string(local_2060);
    std::allocator<char>::~allocator((allocator<char> *)&local_2061);
    fd = buf._8188_4_;
    buf_00 = (void *)std::__cxx11::string::c_str();
    count = std::__cxx11::string::size();
    C_std::Write(fd,buf_00,count);
    std::__cxx11::string::~string((string *)local_2040);
  }
  C_std::Close(buf._8188_4_);
  return;
}

Assistant:

void server_func(const C_std::Network::client_socket &client) {
    int client_sockfd = client.sockfd;
    char buf[BUFSIZ];
    int n;
    while ((n = Read(client_sockfd, buf, BUFSIZ)) > 0) {
        //客户端没有关闭，服务端阻塞等待客户端输入
//        int fd = Open("./test.log", O_CREAT | O_RDWR | O_APPEND, 0644);
//        Write(fd, "read:", 5);
//        Write(fd, buf, n);
        buf[n] = '\0';
        string ret = algorithm(buf);
//        Write(fd, "write:", 6);
//        Write(fd, ret.c_str(), ret.size());
//        close(fd);
        Write(client_sockfd, ret.c_str(), ret.size());
    }
    //关闭客户端socket写端
    Close(client_sockfd);
}